

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O0

CharMapper<unsigned_char> * gmlc::utilities::pairMapper(void)

{
  CharMapper<unsigned_char> *in_RDI;
  uchar ii;
  uchar val;
  uchar defVal;
  CharMapper<unsigned_char> *this;
  undefined1 local_1;
  
  defVal = (uchar)((ulong)in_RDI >> 0x38);
  this = in_RDI;
  CharMapper<unsigned_char>::CharMapper(in_RDI,defVal);
  for (local_1 = '\0'; val = (uchar)((ulong)in_RDI >> 0x30), local_1 != -1;
      local_1 = local_1 + '\x01') {
    CharMapper<unsigned_char>::addKey(this,defVal,val);
  }
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  CharMapper<unsigned_char>::addKey(this,defVal,val);
  return this;
}

Assistant:

CharMapper<unsigned char> pairMapper()
{
    CharMapper<unsigned char> dMap(0);
    for (unsigned char ii = 0; ii < 255; ++ii) {
        dMap.addKey(ii, ii);
    }
    dMap.addKey('(', ')');
    dMap.addKey('<', '>');
    dMap.addKey('[', ']');
    dMap.addKey('{', '}');
    dMap.addKey(')', '(');
    dMap.addKey('>', '<');
    dMap.addKey(']', '[');
    dMap.addKey('}', '{');
    dMap.addKey(0x02, 0x03);  // start of text, end of text
    dMap.addKey(0x03, 0x02);
    dMap.addKey(0x0E, 0x0F);  // XON, XOFF
    dMap.addKey(0x0F, 0x0E);
    dMap.addKey(0x11, 0x13);  // XON, XOFF
    dMap.addKey(0x13, 0x11);
    return dMap;
}